

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

bool __thiscall std::less<Node>::operator()(less<Node> *this,Node *__x,Node *__y)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar5;
  ulong uVar6;
  bool bVar7;
  ulong uVar8;
  byte bVar9;
  
  pfVar4 = *(float **)this;
  ppVar5 = __x->p;
  fVar1 = (ppVar5->first).m_s[0];
  fVar2 = *pfVar4;
  bVar7 = true;
  if (fVar2 <= fVar1) {
    if (fVar1 == fVar2) {
      uVar6 = 0;
      do {
        uVar8 = uVar6;
        if (uVar8 == 5) {
          uVar8 = 5;
          bVar9 = 1;
          goto LAB_00176132;
        }
        fVar3 = (ppVar5->first).m_s[uVar8 + 1];
        if (fVar3 < pfVar4[uVar8 + 1]) {
          bVar9 = 1;
          goto LAB_00176132;
        }
        uVar6 = uVar8 + 1;
      } while (fVar3 == pfVar4[uVar8 + 1]);
      bVar9 = 0;
LAB_00176132:
      if ((bool)(uVar8 < 5 & bVar9)) {
        return true;
      }
    }
    if (fVar1 <= fVar2) {
      if (fVar1 != fVar2) {
LAB_0017618b:
        return ppVar5->second < (uint)pfVar4[6];
      }
      uVar6 = 0;
      do {
        uVar8 = uVar6;
        if (uVar8 == 5) {
          uVar8 = 5;
          bVar9 = 1;
          goto LAB_0017617c;
        }
        fVar1 = (ppVar5->first).m_s[uVar8 + 1];
        if (pfVar4[uVar8 + 1] < fVar1) {
          bVar9 = 1;
          goto LAB_0017617c;
        }
        uVar6 = uVar8 + 1;
      } while (pfVar4[uVar8 + 1] == fVar1);
      bVar9 = 0;
LAB_0017617c:
      if (!(bool)(uVar8 < 5 & bVar9)) goto LAB_0017618b;
    }
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool operator<(const Node& other) const { return *p > *other.p; }